

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O3

long __thiscall xz_rect::random(xz_rect *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  int iVar7;
  double *in_RDX;
  long in_RSI;
  double dStack_30;
  
  dVar1 = *(double *)(in_RSI + 0x18);
  dVar2 = *(double *)(in_RSI + 0x20);
  iVar7 = rand();
  dVar1 = (double)iVar7 * 4.656612873077393e-10 * (dVar2 - dVar1) + dVar1;
  dVar2 = *(double *)(in_RSI + 0x28);
  dVar3 = *(double *)(in_RSI + 0x30);
  auVar5._8_4_ = (int)*(undefined8 *)(in_RSI + 0x38);
  auVar5._0_8_ = dVar1;
  auVar5._12_4_ = (int)((ulong)*(undefined8 *)(in_RSI + 0x38) >> 0x20);
  iVar7 = rand();
  dVar4 = in_RDX[2];
  dVar6 = in_RDX[1];
  dStack_30 = auVar5._8_8_;
  (this->super_hittable)._vptr_hittable = (_func_int **)(dVar1 - *in_RDX);
  (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(dStack_30 - dVar6);
  (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (((double)iVar7 * 4.656612873077393e-10 * (dVar3 - dVar2) + dVar2) - dVar4);
  return (long)this;
}

Assistant:

virtual vec3 random(const vec3& origin) const override {
        auto random_point = vec3(random_double(x0,x1), k, random_double(z0,z1));
        return random_point - origin;
    }